

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::FloatBilerpTexture::ToString_abi_cxx11_(FloatBilerpTexture *this)

{
  string *in_RDI;
  float *in_stack_00000008;
  float *in_stack_00000010;
  TextureMapping2DHandle *in_stack_00000020;
  char *in_stack_00000028;
  float *in_stack_00000040;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,float_const&,float_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,(float *)this,in_stack_00000010,in_stack_00000008,
             in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string FloatBilerpTexture::ToString() const {
    return StringPrintf(
        "[ FloatBilerpTexture mapping: %s v00: %f v01: %f v10: %f v11: %f ]", mapping,
        v00, v01, v10, v11);
}